

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_expr.hpp
# Opt level: O2

rt_vector_expr<viennamath::rt_expression_interface<double>_> *
viennamath::operator*
          (rt_vector_expr<viennamath::rt_expression_interface<double>_> *__return_storage_ptr__,
          ct_constant<8L> *lhs,rt_vector_expr<viennamath::rt_expression_interface<double>_> *rhs)

{
  pointer prVar1;
  long lVar2;
  ulong uVar3;
  type local_50;
  
  rt_vector_expr<viennamath::rt_expression_interface<double>_>::rt_vector_expr
            (__return_storage_ptr__,
             (long)(rhs->
                   super_vector<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>,_std::allocator<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>_>_>
                   ).
                   super__Vector_base<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>,_std::allocator<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(rhs->
                   super_vector<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>,_std::allocator<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>_>_>
                   ).
                   super__Vector_base<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>,_std::allocator<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 3);
  lVar2 = 0;
  for (uVar3 = 0;
      prVar1 = (rhs->
               super_vector<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>,_std::allocator<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>_>_>
               ).
               super__Vector_base<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>,_std::allocator<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
      uVar3 < (ulong)((long)(rhs->
                            super_vector<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>,_std::allocator<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>_>_>
                            ).
                            super__Vector_base<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>,_std::allocator<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)prVar1 >> 3);
      uVar3 = uVar3 + 1) {
    result_of::
    mult<viennamath::ct_constant<8L>,_viennamath::rt_expr<viennamath::rt_expression_interface<double>_>,_true,_false>
    ::instance(&local_50,lhs,
               (rt_expr<viennamath::rt_expression_interface<double>_> *)
               ((long)&(prVar1->rt_expr_)._M_ptr + lVar2));
    rt_expr<viennamath::rt_expression_interface<double>_>::operator=
              ((rt_expr<viennamath::rt_expression_interface<double>_> *)
               ((long)&(((__return_storage_ptr__->
                         super_vector<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>,_std::allocator<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>_>_>
                         ).
                         super__Vector_base<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>,_std::allocator<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->rt_expr_)._M_ptr + lVar2),
               &local_50);
    rt_binary_expr<viennamath::rt_expression_interface<double>_>::~rt_binary_expr(&local_50);
    lVar2 = lVar2 + 8;
  }
  return __return_storage_ptr__;
}

Assistant:

rt_vector_expr<InterfaceType> operator*(T const & lhs, rt_vector_expr<InterfaceType> const & rhs)
  {
    rt_vector_expr<InterfaceType> result(rhs.size());
    for (std::size_t i=0; i<rhs.size(); ++i)
      result[i] = lhs * rhs[i];

    return result;
  }